

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_builder.hpp
# Opt level: O0

void __thiscall
tf::Subflow::Subflow(Subflow *this,Executor *executor,Worker *worker,Node *parent,Graph *graph)

{
  Graph *in_RCX;
  Graph *in_RDX;
  Graph *in_RSI;
  FlowBuilder *in_RDI;
  Graph *in_R8;
  
  FlowBuilder::FlowBuilder(in_RDI,in_R8);
  in_RDI[1]._graph = in_RSI;
  in_RDI[2]._graph = in_RDX;
  in_RDI[3]._graph = in_RCX;
  *(uint *)&((in_RDI[3]._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
       *(uint *)&((in_RDI[3]._graph)->
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0x3fffffff;
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::clear((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           *)0x1ce339);
  return;
}

Assistant:

inline Subflow::Subflow(Executor& executor, Worker& worker, Node* parent, Graph& graph) :
  FlowBuilder {graph}, 
  _executor   {executor}, 
  _worker     {worker}, 
  _parent     {parent} {
  
  // need to reset since there could have iterative control flow
  _parent->_nstate &= ~(NSTATE::JOINED_SUBFLOW | NSTATE::RETAIN_SUBFLOW);

  // clear the graph
  graph.clear();
}